

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O1

_Fwd_list_const_iterator<int> __thiscall
burst::algorithm::
bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
::dummy_search<std::_Fwd_list_const_iterator<int>>
          (bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
           *this,_Fwd_list_const_iterator<int> first,_Fwd_list_const_iterator<int> last,
          bitmask_type *hint)

{
  _WordT _Var1;
  bitmask_type bVar2;
  ulong uVar3;
  
  if (first._M_node != last._M_node) {
    uVar3 = 0xffffffffffffffff;
    do {
      uVar3 = uVar3 + 1;
      if ((*(element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
             **)this)->m_sequence_length <= uVar3) {
        return (_Fwd_list_const_iterator<int>)first._M_node;
      }
      _Var1 = (hint->super__Base_bitset<1UL>)._M_w;
      bVar2 = algorithm::detail::
              element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
              ::operator[](*(element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
                             **)this,(key_type *)(first._M_node + 1));
      (hint->super__Base_bitset<1UL>)._M_w =
           (ulong)((uint)bVar2.super__Base_bitset<1UL>._M_w & (int)_Var1 * 2 + 1U);
      first._M_node = (first._M_node)->_M_next;
    } while (first._M_node != last._M_node);
  }
  return (_Fwd_list_const_iterator<int>)first._M_node;
}

Assistant:

ForwardIterator
                dummy_search
                (
                    ForwardIterator first,
                    ForwardIterator last,
                    bitmask_type & hint
                ) const
            {
                auto dummy_iteration_count = std::size_t{0};
                while (first != last && dummy_iteration_count < m_bitmask_table->length())
                {
                    hint = bit_shift(hint) & (*m_bitmask_table)[*first];

                    ++first;
                    ++dummy_iteration_count;
                }

                return first;
            }